

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O1

DataType __thiscall
csv::internals::_process_potential_exponential
          (internals *this,string_view exponential_part,longdouble *coeff,longdouble *out)

{
  DataType DVar1;
  DataType DVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  string_view in;
  longdouble local_28;
  
  in._M_str = (char *)exponential_part._M_len;
  local_28 = (longdouble)0;
  in._M_len = (size_t)this;
  DVar1 = data_type(in,&local_28,'.');
  DVar2 = CSV_STRING;
  if (((uint)(DVar1 + ~CSV_STRING) < 5) && (DVar2 = CSV_DOUBLE, coeff != (longdouble *)0x0)) {
    lVar3 = -local_28;
    lVar4 = lVar3;
    if (lVar3 <= local_28 || local_28 != lVar3) {
      lVar4 = local_28;
    }
    lVar5 = (longdouble)1;
    lVar6 = (longdouble)0;
    if (lVar6 < lVar4) {
      lVar5 = (longdouble)1;
      do {
        lVar5 = lVar5 * *(longdouble *)(&DAT_0010d030 + (ulong)(lVar3 < local_28) * 0x10);
        lVar6 = lVar6 + (longdouble)1;
      } while (lVar6 < lVar4);
    }
    *coeff = lVar5 * *(longdouble *)exponential_part._M_str;
  }
  return DVar2;
}

Assistant:

HEDLEY_PRIVATE CONSTEXPR_14
        DataType _process_potential_exponential(
            csv::string_view exponential_part,
            const long double& coeff,
            long double * const out) {
            long double exponent = 0;
            auto result = data_type(exponential_part, &exponent);

            // Exponents in scientific notation should not be decimal numbers
            if (result >= DataType::CSV_INT8 && result < DataType::CSV_DOUBLE) {
                if (out) *out = coeff * pow10(exponent);
                return DataType::CSV_DOUBLE;
            }

            return DataType::CSV_STRING;
        }